

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1.c
# Opt level: O0

size_t ptls_asn1_read_type(uint8_t *bytes,size_t bytes_max,int *structure_bit,int *type_class,
                          uint32_t *type_number,int *decode_error,int level,
                          ptls_minicrypto_log_ctx_t *log_ctx)

{
  byte *pbVar1;
  byte bVar2;
  bool bVar3;
  ulong uVar4;
  int end_found;
  int next_byte;
  uint32_t type_number_limit;
  uint32_t long_type;
  uint8_t first_byte;
  size_t byte_index;
  int *decode_error_local;
  uint32_t *type_number_local;
  int *type_class_local;
  int *structure_bit_local;
  size_t bytes_max_local;
  uint8_t *bytes_local;
  
  _long_type = 1;
  bVar2 = *bytes;
  *structure_bit = (int)(uint)bVar2 >> 5 & 1;
  *type_class = (int)(uint)bVar2 >> 6;
  *type_number = bVar2 & 0x1f;
  if (*type_number == 0x1f) {
    next_byte = 0;
    bVar3 = false;
    do {
      if (bytes_max <= _long_type || 0x7fffffff < (uint)next_byte) goto LAB_00116c83;
      uVar4 = _long_type + 1;
      pbVar1 = bytes + _long_type;
      next_byte = *pbVar1 & 0x7f | next_byte << 7;
      _long_type = uVar4;
    } while ((*pbVar1 & 0x80) != 0);
    bVar3 = true;
LAB_00116c83:
    if (bVar3) {
      *type_number = next_byte;
    }
    else {
      _long_type = ptls_asn1_error_message
                             ("Incorrect type coding",bytes_max,_long_type,level,log_ctx);
      *decode_error = 0x235;
    }
  }
  return _long_type;
}

Assistant:

size_t ptls_asn1_read_type(const uint8_t *bytes, size_t bytes_max, int *structure_bit, int *type_class, uint32_t *type_number,
                           int *decode_error, int level, ptls_minicrypto_log_ctx_t *log_ctx)
{
    /* Get the type byte */
    size_t byte_index = 1;
    uint8_t first_byte = bytes[0];
    *structure_bit = (first_byte >> 5) & 1;
    *type_class = (first_byte >> 6) & 3;
    *type_number = first_byte & 31;

    if (*type_number == 31) {
        uint32_t long_type = 0;
        const uint32_t type_number_limit = 0x07FFFFFFF;
        int next_byte;
        int end_found = 0;

        while (byte_index < bytes_max && long_type <= type_number_limit) {
            next_byte = bytes[byte_index++];
            long_type <<= 7;
            long_type |= next_byte & 127;
            if ((next_byte & 128) == 0) {
                end_found = 1;
                break;
            }
        }

        if (end_found) {
            *type_number = long_type;
        } else {
            /* This is an error */
            byte_index = ptls_asn1_error_message("Incorrect type coding", bytes_max, byte_index, level, log_ctx);
            *decode_error = PTLS_ERROR_BER_MALFORMED_TYPE;
        }
    }

    return byte_index;
}